

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O0

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long in_RSI;
  Mat *in_RDI;
  int j;
  float *sptr;
  int i;
  float *outptr;
  int sw;
  int sh;
  Mat m;
  int q;
  int outc;
  int outh;
  int outw;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff04;
  int iVar3;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int iVar4;
  undefined4 in_stack_ffffffffffffff14;
  Mat local_e0;
  Mat *local_a0;
  int local_98;
  int local_94;
  Mat local_90;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = local_2c / *(int *)&in_RDI[2].data;
  local_48 = local_30 / *(int *)&in_RDI[2].data;
  local_4c = local_34 * *(int *)&in_RDI[2].data * *(int *)&in_RDI[2].data;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
              (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08,
              in_stack_ffffffffffffff04,(size_t)in_RDI,(Allocator *)in_stack_fffffffffffffef0);
  bVar1 = Mat::empty(in_stack_fffffffffffffef0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    for (local_50 = 0; local_50 < local_34; local_50 = local_50 + 1) {
      Mat::channel(in_RDI,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      for (local_94 = 0; local_94 < *(int *)&in_RDI[2].data; local_94 = local_94 + 1) {
        for (local_98 = 0; local_98 < *(int *)&in_RDI[2].data; local_98 = local_98 + 1) {
          Mat::channel(in_RDI,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
          in_stack_fffffffffffffef0 = (Mat *)Mat::operator_cast_to_float_(&local_e0);
          Mat::~Mat((Mat *)0x18845a);
          local_a0 = in_stack_fffffffffffffef0;
          for (iVar4 = 0; iVar4 < local_48; iVar4 = iVar4 + 1) {
            pfVar2 = Mat::row(&local_90,iVar4 * *(int *)&in_RDI[2].data + local_94);
            pfVar2 = pfVar2 + local_98;
            for (iVar3 = 0; iVar3 < local_44; iVar3 = iVar3 + 1) {
              *(float *)&local_a0->data = *pfVar2;
              pfVar2 = pfVar2 + *(int *)&in_RDI[2].data;
              local_a0 = (Mat *)((long)&local_a0->data + 4);
            }
          }
        }
      }
      Mat::~Mat((Mat *)0x18859d);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                float* outptr = top_blob.channel(q*stride*stride + sh*stride + sw);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i*stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}